

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O3

void duckdb::AggregateExecutor::UnaryUpdate<duckdb::StddevState,double,duckdb::VarPopOperation>
               (Vector *input,AggregateInputData *aggr_input_data,data_ptr_t state,idx_t count)

{
  unsigned_long *puVar1;
  data_ptr_t pdVar2;
  ulong uVar3;
  sel_t *psVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  idx_t iVar8;
  ulong uVar9;
  idx_t iVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  double dVar14;
  undefined1 auVar15 [16];
  double dVar16;
  double dVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  double dVar20;
  undefined1 auVar21 [16];
  AggregateUnaryInput input_data;
  UnifiedVectorFormat local_68;
  
  if (input->vector_type == FLAT_VECTOR) {
    pdVar2 = input->data;
    FlatVector::VerifyFlatVector(input);
    if (0x3f < count + 0x3f) {
      puVar1 = (input->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      uVar5 = 0;
      uVar9 = 0;
      do {
        if (puVar1 == (unsigned_long *)0x0) {
          uVar6 = uVar9 + 0x40;
          if (count <= uVar9 + 0x40) {
            uVar6 = count;
          }
LAB_00d19273:
          lVar11 = uVar6 - uVar9;
          uVar7 = uVar9;
          if (uVar9 <= uVar6 && lVar11 != 0) {
            dVar14 = *(double *)(state + 8);
            dVar16 = *(double *)(state + 0x10);
            lVar13 = *(long *)state;
            do {
              lVar13 = lVar13 + 1;
              dVar17 = *(double *)(pdVar2 + uVar9 * 8);
              dVar20 = dVar17 - dVar14;
              auVar15._8_4_ = (int)((ulong)lVar13 >> 0x20);
              auVar15._0_8_ = lVar13;
              auVar15._12_4_ = 0x45300000;
              dVar14 = dVar20 / ((auVar15._8_8_ - 1.9342813113834067e+25) +
                                ((double)CONCAT44(0x43300000,(int)lVar13) - 4503599627370496.0)) +
                       dVar14;
              dVar16 = dVar16 + (dVar17 - dVar14) * dVar20;
              uVar9 = uVar9 + 1;
            } while (uVar6 != uVar9);
            *(long *)state = lVar11 + *(long *)state;
            *(double *)(state + 8) = dVar14;
            *(double *)(state + 0x10) = dVar16;
            uVar7 = uVar6;
          }
        }
        else {
          uVar3 = puVar1[uVar5];
          uVar6 = uVar9 + 0x40;
          if (count <= uVar9 + 0x40) {
            uVar6 = count;
          }
          if (uVar3 == 0xffffffffffffffff) goto LAB_00d19273;
          uVar7 = uVar6;
          if ((uVar3 != 0) && (uVar7 = uVar9, uVar9 < uVar6)) {
            uVar12 = 0;
            do {
              if ((uVar3 >> (uVar12 & 0x3f) & 1) != 0) {
                lVar11 = *(long *)state + 1;
                *(long *)state = lVar11;
                dVar14 = *(double *)(pdVar2 + uVar12 * 8 + uVar9 * 8);
                dVar16 = dVar14 - *(double *)(state + 8);
                auVar18._8_4_ = (int)((ulong)lVar11 >> 0x20);
                auVar18._0_8_ = lVar11;
                auVar18._12_4_ = 0x45300000;
                dVar17 = dVar16 / ((auVar18._8_8_ - 1.9342813113834067e+25) +
                                  ((double)CONCAT44(0x43300000,(int)lVar11) - 4503599627370496.0)) +
                         *(double *)(state + 8);
                *(double *)(state + 8) = dVar17;
                *(double *)(state + 0x10) = (dVar14 - dVar17) * dVar16 + *(double *)(state + 0x10);
              }
              uVar12 = uVar12 + 1;
              uVar7 = uVar6;
            } while (uVar6 - uVar9 != uVar12);
          }
        }
        uVar5 = uVar5 + 1;
        uVar9 = uVar7;
      } while (uVar5 != count + 0x3f >> 6);
    }
  }
  else if (input->vector_type == CONSTANT_VECTOR) {
    puVar1 = (input->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if ((puVar1 == (unsigned_long *)0x0) || ((*puVar1 & 1) != 0)) {
      local_68.data = (data_ptr_t)&input->validity;
      local_68.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
           (unsigned_long *)0x0;
      local_68.sel = (SelectionVector *)aggr_input_data;
      STDDevBaseOperation::ConstantOperation<double,duckdb::StddevState,duckdb::VarPopOperation>
                ((StddevState *)state,(double *)input->data,(AggregateUnaryInput *)&local_68,count);
    }
  }
  else {
    UnifiedVectorFormat::UnifiedVectorFormat(&local_68);
    Vector::ToUnifiedFormat(input,count,&local_68);
    if (local_68.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      if (count != 0) {
        dVar14 = *(double *)(state + 8);
        dVar16 = *(double *)(state + 0x10);
        iVar8 = 0;
        do {
          iVar10 = iVar8;
          if ((local_68.sel)->sel_vector != (sel_t *)0x0) {
            iVar10 = (idx_t)(local_68.sel)->sel_vector[iVar8];
          }
          lVar11 = *(long *)state + 1 + iVar8;
          dVar17 = *(double *)(local_68.data + iVar10 * 8) - dVar14;
          auVar21._8_4_ = (int)((ulong)lVar11 >> 0x20);
          auVar21._0_8_ = lVar11;
          auVar21._12_4_ = 0x45300000;
          dVar14 = dVar14 + dVar17 / ((auVar21._8_8_ - 1.9342813113834067e+25) +
                                     ((double)CONCAT44(0x43300000,(int)lVar11) - 4503599627370496.0)
                                     );
          dVar16 = dVar16 + (*(double *)(local_68.data + iVar10 * 8) - dVar14) * dVar17;
          iVar8 = iVar8 + 1;
        } while (count != iVar8);
        *(idx_t *)state = *(long *)state + count;
        *(double *)(state + 8) = dVar14;
        *(double *)(state + 0x10) = dVar16;
      }
    }
    else if (count != 0) {
      psVar4 = (local_68.sel)->sel_vector;
      iVar8 = 0;
      do {
        iVar10 = iVar8;
        if (psVar4 != (sel_t *)0x0) {
          iVar10 = (idx_t)psVar4[iVar8];
        }
        if ((local_68.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[iVar10 >> 6]
             >> (iVar10 & 0x3f) & 1) != 0) {
          lVar11 = *(long *)state + 1;
          *(long *)state = lVar11;
          dVar14 = *(double *)(local_68.data + iVar10 * 8);
          dVar16 = dVar14 - *(double *)(state + 8);
          auVar19._8_4_ = (int)((ulong)lVar11 >> 0x20);
          auVar19._0_8_ = lVar11;
          auVar19._12_4_ = 0x45300000;
          dVar17 = dVar16 / ((auVar19._8_8_ - 1.9342813113834067e+25) +
                            ((double)CONCAT44(0x43300000,(int)lVar11) - 4503599627370496.0)) +
                   *(double *)(state + 8);
          *(double *)(state + 8) = dVar17;
          *(double *)(state + 0x10) = (dVar14 - dVar17) * dVar16 + *(double *)(state + 0x10);
        }
        iVar8 = iVar8 + 1;
      } while (count != iVar8);
    }
    if (local_68.owned_sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_68.owned_sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_68.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_68.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
  }
  return;
}

Assistant:

static void UnaryUpdate(Vector &input, AggregateInputData &aggr_input_data, data_ptr_t state, idx_t count) {
		switch (input.GetVectorType()) {
		case VectorType::CONSTANT_VECTOR: {
			if (OP::IgnoreNull() && ConstantVector::IsNull(input)) {
				return;
			}
			auto idata = ConstantVector::GetData<INPUT_TYPE>(input);
			AggregateUnaryInput input_data(aggr_input_data, ConstantVector::Validity(input));
			OP::template ConstantOperation<INPUT_TYPE, STATE_TYPE, OP>(*reinterpret_cast<STATE_TYPE *>(state), *idata,
			                                                           input_data, count);
			break;
		}
#ifndef DUCKDB_SMALLER_BINARY
		case VectorType::FLAT_VECTOR: {
			auto idata = FlatVector::GetData<INPUT_TYPE>(input);
			UnaryFlatUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(idata, aggr_input_data, (STATE_TYPE *)state, count,
			                                                FlatVector::Validity(input));
			break;
		}
#endif
		default: {
			UnifiedVectorFormat idata;
			input.ToUnifiedFormat(count, idata);
			UnaryUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(UnifiedVectorFormat::GetData<INPUT_TYPE>(idata),
			                                            aggr_input_data, (STATE_TYPE *)state, count, idata.validity,
			                                            *idata.sel);
			break;
		}
		}
	}